

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O0

void __thiscall FunctionTable::GetCurrentTermTopLabel(FunctionTable *this,string *top_label)

{
  const_reference this_00;
  string local_38;
  string *local_18;
  string *top_label_local;
  FunctionTable *this_local;
  
  local_18 = top_label;
  top_label_local = (string *)this;
  this_00 = std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>::operator[]
                      (&this->m_func_table,(long)this->m_current_term_ptr);
  FunctionTableTerm::GetTopLabel_abi_cxx11_(&local_38,this_00);
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void FunctionTable::GetCurrentTermTopLabel(string& top_label) const {
    top_label = m_func_table[m_current_term_ptr].GetTopLabel();
}